

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void __thiscall
Tester::reportError<char_const*,std::__cxx11::string>
          (Tester *this,string *msg,char **args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string_view format_str;
  string local_30;
  
  format_str.size_ = (size_t)args;
  format_str.data_ = (char *)msg->_M_string_length;
  fmt::v5::format<char_const*,std::__cxx11::string>
            (&local_30,(v5 *)(msg->_M_dataplus)._M_p,format_str,(char **)args_1,in_R9);
  reportError(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void reportError(const std::string& msg, Args&&... args) {
    reportError(fmt::format(msg, args...));
  }